

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# randomx.cpp
# Opt level: O1

randomx_cache * randomx_alloc_cache(randomx_flags flags)

{
  randomx_cache *cache;
  JitCompilerX86 *pJVar1;
  uint8_t *puVar2;
  undefined *puVar3;
  char cVar4;
  long lVar5;
  int extraout_EDX;
  undefined1 *puVar6;
  long unaff_RBP;
  randomx_cache *prVar7;
  uint *puVar8;
  ulong uVar9;
  code *pcVar10;
  
  puVar6 = &stack0xffffffffffffffd8;
  if ((flags & RANDOMX_FLAG_ARGON2_AVX2) == RANDOMX_FLAG_DEFAULT) {
    if ((flags & RANDOMX_FLAG_ARGON2_SSSE3) == RANDOMX_FLAG_DEFAULT) {
      pcVar10 = randomx_argon2_fill_segment_ref;
    }
    else {
      pcVar10 = randomx_argon2_impl_ssse3();
    }
  }
  else {
    pcVar10 = randomx_argon2_impl_avx2();
  }
  if ((Instruction)pcVar10 == (Instruction)0x0) {
    return (randomx_cache *)0x0;
  }
  cache = (randomx_cache *)operator_new(0x83a8);
  puVar8 = (uint *)&(cache->cacheKey).field_2;
  prVar7 = cache;
  memset(cache,0,0x83a8);
  (cache->cacheKey)._M_dataplus._M_p = (pointer)puVar8;
  (cache->cacheKey)._M_string_length = 0;
  (cache->cacheKey).field_2._M_local_buf[0] = '\0';
  cache->argonImpl = pcVar10;
  uVar9 = (ulong)(flags & (RANDOMX_FLAG_JIT|RANDOMX_FLAG_LARGE_PAGES));
  lVar5 = (long)(int)(&switchD_0010c568::switchdataD_00117ac0)[uVar9];
  cVar4 = (char)((long)&switchD_0010c568::switchdataD_00117ac0 + lVar5);
  switch(flags & (RANDOMX_FLAG_JIT|RANDOMX_FLAG_LARGE_PAGES)) {
  case RANDOMX_FLAG_DEFAULT:
    cache->dealloc = randomx::deallocCache<randomx::AlignedAllocator<64ul>>;
    cache->jit = (JitCompiler *)0x0;
    cache->initialize = randomx::initCache;
    cache->datasetInit = randomx::initDataset;
    puVar2 = (uint8_t *)randomx::AlignedAllocator<64UL>::allocMemory(0x10000000);
    goto LAB_0010c672;
  case RANDOMX_FLAG_LARGE_PAGES:
    cache->dealloc = randomx::deallocCache<randomx::LargePageAllocator>;
    cache->jit = (JitCompiler *)0x0;
    cache->initialize = randomx::initCache;
    cache->datasetInit = randomx::initDataset;
    puVar2 = (uint8_t *)randomx::LargePageAllocator::allocMemory(0x10000000);
    goto LAB_0010c672;
  default:
    operator_delete(puVar8);
    if (extraout_EDX == 1) {
      __cxa_begin_catch(&switchD_0010c568::switchdataD_00117ac0);
      if (cache != (randomx_cache *)0x0) {
        randomx_release_cache(cache);
      }
      __cxa_end_catch();
      return (randomx_cache *)0x0;
    }
    _Unwind_Resume(&switchD_0010c568::switchdataD_00117ac0);
  case RANDOMX_FLAG_JIT:
    cache->dealloc = randomx::deallocCache<randomx::AlignedAllocator<64ul>>;
    pJVar1 = (JitCompilerX86 *)operator_new(0x48);
    randomx::JitCompilerX86::JitCompilerX86(pJVar1);
    cache->jit = pJVar1;
    cache->initialize = randomx::initCacheCompile;
    cache->datasetInit = (DatasetInitFunc *)pJVar1->code;
    puVar2 = (uint8_t *)randomx::AlignedAllocator<64UL>::allocMemory(0x10000000);
    goto LAB_0010c672;
  case RANDOMX_FLAG_JIT|RANDOMX_FLAG_LARGE_PAGES:
    cache->dealloc = randomx::deallocCache<randomx::LargePageAllocator>;
    pJVar1 = (JitCompilerX86 *)operator_new(0x48);
    randomx::JitCompilerX86::JitCompilerX86(pJVar1);
    cache->jit = pJVar1;
    cache->initialize = randomx::initCacheCompile;
    cache->datasetInit = (DatasetInitFunc *)pJVar1->code;
    puVar2 = (uint8_t *)randomx::LargePageAllocator::allocMemory(0x10000000);
LAB_0010c672:
    cache->memory = puVar2;
    return cache;
  case RANDOMX_FLAG_JIT|RANDOMX_FLAG_HARD_AES:
    if ((ulong)((long)&switchD_0010c568::switchdataD_00117ac0 + lVar5) < 2) {
      return (randomx_cache *)(ulong)*(uint *)&prVar7->memory;
    }
    prVar7 = cache + 1;
    prVar7->programs[0].programBuffer[0x135].opcode = '\0';
    prVar7->programs[0].programBuffer[0x135].dst = '\0';
    prVar7->programs[0].programBuffer[0x135].src = '\0';
    prVar7->programs[0].programBuffer[0x135].mod = '\0';
    prVar7->programs[0].programBuffer[0x135].imm32 = 0;
    prVar7 = cache + 1;
    prVar7->programs[0].programBuffer[0x136].opcode = '\0';
    prVar7->programs[0].programBuffer[0x136].dst = '\0';
    prVar7->programs[0].programBuffer[0x136].src = '\0';
    prVar7->programs[0].programBuffer[0x136].mod = '\0';
    prVar7->programs[0].programBuffer[0x136].imm32 = 0;
    cache[1].programs[0].programBuffer[0x137] = (Instruction)pcVar10;
    cache[1].programs[0].programBuffer[0x139] =
         (Instruction)(cache[1].programs[0].programBuffer + 0x13b);
    cache[1].programs[0].programBuffer[0x13a] = (Instruction)pcVar10;
    cache[1].programs[0].programBuffer[0x13b].opcode = '\0';
    puVar3 = &randomx::InterpretedLightVm<randomx::AlignedAllocator<64ul>,true>::vtable;
    break;
  case RANDOMX_FLAG_JIT|RANDOMX_FLAG_HARD_AES|RANDOMX_FLAG_LARGE_PAGES:
    switchD_0010c568::switchdataD_00117ac0 = 0xffff7aea;
    "NSt6thread11_State_implINS_8_InvokerISt5tupleIJPFvP10randomx_vmRSt6atomicIjER10AtomicHashjiiES4_St17reference_wrapperIS6_ESC_IS8_EijiEEEEEE"
    [lVar5 + 0x57] =
         "NSt6thread11_State_implINS_8_InvokerISt5tupleIJPFvP10randomx_vmRSt6atomicIjER10AtomicHashjiiES4_St17reference_wrapperIS6_ESC_IS8_EijiEEEEEE"
         [lVar5 + 0x57] + cVar4;
    *(char *)(unaff_RBP + -0x77) = *(char *)(unaff_RBP + -0x77) + cVar4;
    puVar6 = (undefined1 *)0xa1024;
    (&UNK_00117a86)[lVar5] = (&UNK_00117a86)[lVar5] + -0x16;
    UINT_00117afc._3_1_ = 0xfe;
    puVar3 = &randomx::InterpretedVm<randomx::LargePageAllocator,false>::vtable;
    break;
  case RANDOMX_FLAG_JIT|RANDOMX_FLAG_FULL_MEM:
    switchD_0010c568::switchdataD_00117ac0 =
         CONCAT31(switchD_0010c568::switchdataD_00117ac0._1_3_,0x6a);
    puVar8 = &switchD_0010c568::switchdataD_00117ac0;
    memset(&switchD_0010c568::switchdataD_00117ac0,0,0xac0);
    randomx::CompiledVm<randomx::LargePageAllocator,_true,_false>::CompiledVm
              ((CompiledVm<randomx::LargePageAllocator,_true,_false> *)
               &switchD_0010c568::switchdataD_00117ac0);
    puVar3 = &randomx::CompiledLightVm<randomx::LargePageAllocator,true,false>::vtable;
    puVar6 = &stack0xffffffffffffffd8;
    break;
  case RANDOMX_FLAG_JIT|RANDOMX_FLAG_FULL_MEM|RANDOMX_FLAG_LARGE_PAGES:
    *(char *)(unaff_RBP + 0x31) = *(char *)(unaff_RBP + 0x31) + -0x40;
    _UNK_00117ab6 = 0xc0b0202;
    halt_baddata();
  case RANDOMX_FLAG_JIT|RANDOMX_FLAG_FULL_MEM|RANDOMX_FLAG_HARD_AES:
    switchD_0010c568::switchdataD_00117ac0 =
         CONCAT31(switchD_0010c568::switchdataD_00117ac0._1_3_,0x6a);
    puVar8 = &switchD_0010c568::switchdataD_00117ac0;
    memset(&switchD_0010c568::switchdataD_00117ac0,0,0xac0);
    randomx::CompiledVm<randomx::LargePageAllocator,_false,_false>::CompiledVm
              ((CompiledVm<randomx::LargePageAllocator,_false,_false> *)
               &switchD_0010c568::switchdataD_00117ac0);
    puVar3 = &randomx::CompiledLightVm<randomx::LargePageAllocator,false,false>::vtable;
    puVar6 = &stack0xffffffffffffffd8;
    break;
  case RANDOMX_FLAG_JIT|RANDOMX_FLAG_FULL_MEM|RANDOMX_FLAG_HARD_AES|RANDOMX_FLAG_LARGE_PAGES:
    switchD_0010c568::switchdataD_00117ac0 = 0xffff7aea;
    "NSt6thread11_State_implINS_8_InvokerISt5tupleIJPFvP10randomx_vmRSt6atomicIjER10AtomicHashjiiES4_St17reference_wrapperIS6_ESC_IS8_EijiEEEEEE"
    [lVar5 + 0x57] =
         "NSt6thread11_State_implINS_8_InvokerISt5tupleIJPFvP10randomx_vmRSt6atomicIjER10AtomicHashjiiES4_St17reference_wrapperIS6_ESC_IS8_EijiEEEEEE"
         [lVar5 + 0x57] + cVar4;
    *(char *)(unaff_RBP + -0x77) = *(char *)(unaff_RBP + -0x77) + cVar4;
    (&UNK_00117a86)[lVar5] = (&UNK_00117a86)[lVar5] + -0x16;
    UINT_00117afc._3_1_ = 0xfe;
    puVar3 = &randomx::InterpretedLightVm<randomx::LargePageAllocator,true>::vtable;
    puVar6 = (undefined1 *)0xa1024;
  }
  ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
    *)&((randomx_cache *)puVar8)->memory)->_M_allocated_capacity = (size_type)(puVar3 + 0x10);
  if (uVar9 != 0) {
    pcVar10 = *(code **)(((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)&((randomx_cache *)puVar8)->memory)->_M_allocated_capacity + 0x30);
    *(undefined8 *)(puVar6 + -8) = 0x10cec2;
    (*pcVar10)(puVar8,uVar9);
    *(undefined8 *)(puVar6 + -8) = 0x10ced8;
    std::__cxx11::string::_M_assign
              ((string *)(((randomx_cache *)puVar8)->programs[0].programBuffer + 0x13c));
  }
  if (cache != (randomx_cache *)0x0) {
    pcVar10 = *(code **)(((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)&((randomx_cache *)puVar8)->memory)->_M_allocated_capacity + 0x28);
    *(undefined8 *)(puVar6 + -8) = 0x10cee9;
    (*pcVar10)(puVar8,cache);
  }
  pcVar10 = *(code **)(((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)&((randomx_cache *)puVar8)->memory)->_M_allocated_capacity + 0x10);
  *(undefined8 *)(puVar6 + -8) = 0x10cef2;
  (*pcVar10)(puVar8);
  return (randomx_cache *)puVar8;
}

Assistant:

randomx_cache *randomx_alloc_cache(randomx_flags flags) {
		randomx_cache *cache = nullptr;
		auto impl = randomx::selectArgonImpl(flags);
		if (impl == nullptr) {
			return cache;
		}

		try {
			cache = new randomx_cache();
			cache->argonImpl = impl;
			switch ((int)(flags & (RANDOMX_FLAG_JIT | RANDOMX_FLAG_LARGE_PAGES))) {
				case RANDOMX_FLAG_DEFAULT:
					cache->dealloc = &randomx::deallocCache<randomx::DefaultAllocator>;
					cache->jit = nullptr;
					cache->initialize = &randomx::initCache;
					cache->datasetInit = &randomx::initDataset;
					cache->memory = (uint8_t*)randomx::DefaultAllocator::allocMemory(randomx::CacheSize);
					break;

				case RANDOMX_FLAG_JIT:
					cache->dealloc = &randomx::deallocCache<randomx::DefaultAllocator>;
					cache->jit = new randomx::JitCompiler();
					cache->initialize = &randomx::initCacheCompile;
					cache->datasetInit = cache->jit->getDatasetInitFunc();
					cache->memory = (uint8_t*)randomx::DefaultAllocator::allocMemory(randomx::CacheSize);
					break;

				case RANDOMX_FLAG_LARGE_PAGES:
					cache->dealloc = &randomx::deallocCache<randomx::LargePageAllocator>;
					cache->jit = nullptr;
					cache->initialize = &randomx::initCache;
					cache->datasetInit = &randomx::initDataset;
					cache->memory = (uint8_t*)randomx::LargePageAllocator::allocMemory(randomx::CacheSize);
					break;

				case RANDOMX_FLAG_JIT | RANDOMX_FLAG_LARGE_PAGES:
					cache->dealloc = &randomx::deallocCache<randomx::LargePageAllocator>;
					cache->jit = new randomx::JitCompiler();
					cache->initialize = &randomx::initCacheCompile;
					cache->datasetInit = cache->jit->getDatasetInitFunc();
					cache->memory = (uint8_t*)randomx::LargePageAllocator::allocMemory(randomx::CacheSize);
					break;

				default:
					UNREACHABLE;
			}
		}
		catch (std::exception &ex) {
			if (cache != nullptr) {
				randomx_release_cache(cache);
				cache = nullptr;
			}
		}

		return cache;
	}